

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReader.cpp
# Opt level: O0

void __thiscall MILBlob::Blob::MMapFileReader::MMapFileReader(MMapFileReader *this,string *filename)

{
  _Head_base<0UL,__IO_FILE_*,_false> __len;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  runtime_error *prVar4;
  FILE *pFVar5;
  void *__p;
  pointer pvVar6;
  pointer p;
  Span<unsigned_char,_18446744073709551615UL> local_1b0;
  undefined1 local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  anon_class_8_1_5f322c24 local_178;
  function<void_(void_*)> local_170;
  undefined1 local_150 [8];
  unique_ptr<void,_std::function<void_(void_*)>_> mmapPtr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  _func_int__IO_FILE_ptr *local_100;
  undefined1 local_f8 [8];
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> f;
  size_t fileLength;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  stat fileInfo;
  string *filename_local;
  MMapFileReader *this_local;
  
  std::unique_ptr<void,std::function<void(void*)>>::unique_ptr<std::function<void(void*)>,void>
            ((unique_ptr<void,std::function<void(void*)>> *)this);
  Util::Span<unsigned_char,_18446744073709551615UL>::Span<18446744073709551615UL,_0>
            (&this->m_dataSpan);
  this->m_isEncrypted = false;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = stat(pcVar3,(stat *)local_b8);
  if (iVar2 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_d8,"Could not open ",filename);
    std::runtime_error::runtime_error(prVar4,(string *)&local_d8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)fileInfo.st_rdev;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pFVar5 = fopen(pcVar3,"r");
  local_100 = fclose;
  std::unique_ptr<_IO_FILE,int(*)(_IO_FILE*)>::unique_ptr<int(*)(_IO_FILE*),void>
            ((unique_ptr<_IO_FILE,int(*)(_IO_FILE*)> *)local_f8,(pointer)pFVar5,&local_100);
  bVar1 = std::operator!=((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_f8,(nullptr_t)0x0);
  __len = f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
          super__Head_base<0UL,__IO_FILE_*,_false>;
  if (!bVar1) {
    mmapPtr._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl._7_1_ = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_120,"Unable to read file ",filename);
    std::runtime_error::runtime_error(prVar4,(string *)&local_120);
    mmapPtr._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl._7_1_ = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pFVar5 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                             ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_f8);
  iVar2 = fileno(pFVar5);
  __p = mmap((void *)0x0,(size_t)__len._M_head_impl,1,2,iVar2,0);
  local_178.length =
       (size_t)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
               super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
               super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
  std::function<void(void*)>::
  function<MILBlob::Blob::MMapFileReader::MMapFileReader(std::__cxx11::string_const&)::__0,void>
            ((function<void(void*)> *)&local_170,&local_178);
  std::unique_ptr<void,std::function<void(void*)>>::unique_ptr<std::function<void(void*)>,void>
            ((unique_ptr<void,std::function<void(void*)>> *)local_150,__p,&local_170);
  std::function<void_(void_*)>::~function(&local_170);
  pvVar6 = std::unique_ptr<void,_std::function<void_(void_*)>_>::get
                     ((unique_ptr<void,_std::function<void_(void_*)>_> *)local_150);
  if (pvVar6 != (pointer)0x0) {
    pvVar6 = std::unique_ptr<void,_std::function<void_(void_*)>_>::get
                       ((unique_ptr<void,_std::function<void_(void_*)>_> *)local_150);
    if (pvVar6 != (pointer)0xffffffffffffffff) {
      p = (pointer)std::unique_ptr<void,_std::function<void_(void_*)>_>::get
                             ((unique_ptr<void,_std::function<void_(void_*)>_> *)local_150);
      Util::Span<unsigned_char,_18446744073709551615UL>::Span<18446744073709551615UL,_0>
                (&local_1b0,p,
                 (size_t)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      (this->m_dataSpan).m_ptr = local_1b0.m_ptr;
      (this->m_dataSpan).m_size.m_size = local_1b0.m_size.m_size;
      std::unique_ptr<void,_std::function<void_(void_*)>_>::operator=
                (&this->m_mmap,(unique_ptr<void,_std::function<void_(void_*)>_> *)local_150);
      std::unique_ptr<void,_std::function<void_(void_*)>_>::~unique_ptr
                ((unique_ptr<void,_std::function<void_(void_*)>_> *)local_150);
      std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr
                ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_f8);
      return;
    }
  }
  local_199 = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_198,"Unable to mmap file ",filename);
  std::runtime_error::runtime_error(prVar4,(string *)&local_198);
  local_199 = 0;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MMapFileReader::MMapFileReader(const std::string& filename) : m_isEncrypted(false)
{
    // verify file exists and find its length
    struct stat fileInfo;
    if (stat(filename.c_str(), &fileInfo) != 0) {
        throw std::runtime_error("Could not open " + filename);
    }

    // mmap works in size_t units to be compatible with virtual address space units
    auto fileLength = static_cast<size_t>(fileInfo.st_size);

    // wrap fopen/fclose in exception-safe type
    std::unique_ptr<FILE, decltype(&fclose)> f(fopen(filename.c_str(), "r"), fclose);

    MILVerifyIsTrue(f != nullptr, std::runtime_error, "Unable to read file " + filename);

    // wrap mmap/munmap in exception-safe type
    std::unique_ptr<void, std::function<void(void*)>> mmapPtr(
        mmap(nullptr, fileLength, PROT_READ, MAP_PRIVATE, fileno(f.get()), 0 /*offset*/),
        [length = fileLength](void* ptr) { munmap(ptr, length); });

    // NOLINTNEXTLINE(cppcoreguidelines-pro-type-cstyle-cast) -- MAP_FAILED is (void*) -1.
    MILVerifyIsTrue(mmapPtr.get() != nullptr && mmapPtr.get() != MAP_FAILED,
                    std::runtime_error,
                    "Unable to mmap file " + filename);

    m_dataSpan = Util::Span<uint8_t>(reinterpret_cast<uint8_t*>(mmapPtr.get()), fileLength);

    // Keep mmaping alive
    m_mmap = std::move(mmapPtr);
}